

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O2

SUNErrCode SUNNonlinSolInitialize(SUNNonlinearSolver NLS)

{
  _func_SUNErrCode_SUNNonlinearSolver *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = NLS->ops->initialize;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNNonlinearSolver *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(NLS);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolInitialize(SUNNonlinearSolver NLS)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(NLS));
  if (NLS->ops->initialize) { ier = NLS->ops->initialize(NLS); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(NLS));
  return (ier);
}